

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::AcesOutputFile::AcesOutputFile
          (AcesOutputFile *this,OStream *os,Header *header,RgbaChannels rgbaChannels,int numThreads)

{
  AttributeMap *pAVar1;
  OutputFile *this_00;
  Chromaticities *pCVar2;
  _func_int **pp_Var3;
  undefined4 in_ECX;
  Header *in_RDI;
  undefined4 in_R8D;
  Header newHeader;
  Header *in_stack_ffffffffffffff98;
  Header *in_stack_ffffffffffffffa0;
  Chromaticities *in_stack_ffffffffffffffa8;
  Header *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffc8;
  RgbaChannels in_stack_ffffffffffffffcc;
  Header *in_stack_ffffffffffffffd0;
  OStream *in_stack_ffffffffffffffd8;
  
  *(undefined ***)&(in_RDI->_map)._M_t._M_impl = &PTR__AcesOutputFile_002abba8;
  pAVar1 = &in_RDI->_map;
  this_00 = (OutputFile *)operator_new(8);
  Data::Data((Data *)this_00);
  *(OutputFile **)&(pAVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = this_00;
  Header::compression((Header *)0x172302);
  anon_unknown_14::checkCompression((Compression)((ulong)in_RDI >> 0x20));
  Header::Header(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pCVar2 = acesChromaticities();
  addChromaticities(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  acesChromaticities();
  addAdoptedNeutral(in_stack_ffffffffffffffa0,(V2f *)in_stack_ffffffffffffff98);
  pp_Var3 = (_func_int **)operator_new(0x18);
  RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  ((*(OutputFile **)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header)->
  super_GenericOutputFile)._vptr_GenericOutputFile = pp_Var3;
  RgbaOutputFile::setYCRounding((RgbaOutputFile *)in_RDI,(uint)((ulong)pCVar2 >> 0x20),(uint)pCVar2)
  ;
  Header::~Header(in_RDI);
  return;
}

Assistant:

AcesOutputFile::AcesOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    RgbaChannels                             rgbaChannels,
    int                                      numThreads)
    : _data (new Data)
{
    checkCompression (header.compression ());

    Header newHeader = header;
    addChromaticities (newHeader, acesChromaticities ());
    addAdoptedNeutral (newHeader, acesChromaticities ().white);

    _data->rgbaFile = new RgbaOutputFile (os, header, rgbaChannels, numThreads);

    _data->rgbaFile->setYCRounding (7, 6);
}